

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_caster<bool,_void> *
pybind11::detail::load_type<bool,void>(type_caster<bool,_void> *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  type_caster<bool,_void> *in_RSI;
  handle in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  bVar1 = type_caster<bool,_void>::load(in_RSI,in_RDI,SUB81((ulong)*(undefined8 *)in_RSI >> 0x38,0))
  ;
  if (!bVar1) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this,in_stack_ffffffffffffffc8);
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  return (type_caster<bool,_void> *)in_RDI.m_ptr;
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(type::handle_of(handle)) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}